

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

double __thiscall despot::Parser::LogNumInitialStates(Parser *this)

{
  pointer pTVar1;
  pointer pSVar2;
  int v;
  int iVar3;
  int s;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar5 = 0.0;
  for (uVar4 = 0;
      pSVar2 = (this->curr_state_vars_).
               super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(this->curr_state_vars_).
                             super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0xc0);
      uVar4 = uVar4 + 1) {
    dVar6 = 0.0;
    for (iVar3 = 0;
        iVar3 < (int)((ulong)((long)*(pointer *)
                                     ((long)&pSVar2[uVar4].super_NamedVar.super_Variable.values_ + 8
                                     ) -
                             *(long *)&pSVar2[uVar4].super_NamedVar.super_Variable.values_.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data) >> 5); iVar3 = iVar3 + 1) {
      pTVar1 = (this->initial_belief_funcs_).
               super__Vector_base<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar7 = (double)(**(code **)((long)pTVar1[uVar4].super_CPT.super_Function._vptr_Function +
                                  0x20))(pTVar1 + uVar4,0,iVar3);
      dVar6 = dVar6 + (double)(-(ulong)(0.0 < dVar7) & 0x3ff0000000000000);
      pSVar2 = (this->curr_state_vars_).
               super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    dVar6 = log2(dVar6);
    dVar5 = dVar5 + dVar6;
  }
  return dVar5;
}

Assistant:

double Parser::LogNumInitialStates() const {
	double log_num_states = 0;

	for (int s = 0; s < curr_state_vars_.size(); s++) {
		double n = 0;
		for (int v = 0; v < curr_state_vars_[s].Size(); v++)
			n += (initial_belief_funcs_[s].GetValue(0, v) > 0);
		log_num_states += log2(n);
	}

	return log_num_states;
}